

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

QString * msgErrorSettingEllipticCurves(QString *why)

{
  long lVar1;
  undefined8 in_RSI;
  int fieldWidth;
  QString *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  QString *this;
  QChar local_22 [8];
  QChar in_stack_ffffffffffffffee;
  
  fieldWidth = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  this = (QString *)(local_22 + 1);
  QSslSocket::tr((char *)in_RDI,(char *)in_RDI,in_stack_ffffffffffffff9c);
  QChar::QChar<char16_t,_true>(local_22,L' ');
  QString::arg<QString,_true>
            (this,(QString *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),fieldWidth,
             in_stack_ffffffffffffffee);
  QString::~QString((QString *)0x15ff9d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QString msgErrorSettingEllipticCurves(const QString &why)
{
    return QSslSocket::tr("Error when setting the elliptic curves (%1)").arg(why);
}